

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(uchar lhs,SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  int iVar2;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> in_ESI;
  undefined1 in_DIL;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> unaff_retaddr;
  uchar ret;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  int *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  uint uVar3;
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffff0;
  undefined3 in_stack_fffffffffffffff4;
  undefined4 uVar4;
  int in_stack_fffffffffffffffc;
  
  uVar4 = CONCAT13(in_DIL,in_stack_fffffffffffffff4);
  SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &stack0xfffffffffffffff0);
  bVar1 = DivisionCornerCaseHelper<int,_unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase1
                    ((uchar)((uint)in_stack_fffffffffffffffc >> 0x18),unaff_retaddr,
                     (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     CONCAT44(uVar4,in_stack_fffffffffffffff0.m_int));
  if ((!bVar1) &&
     (bVar1 = DivisionCornerCaseHelper2<int,_unsigned_char,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
              ::DivisionCornerCase2
                        ((uchar)((uint)uVar4 >> 0x18),in_ESI,
                         (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                         &stack0xfffffffffffffff0), !bVar1)) {
    uVar3 = in_stack_ffffffffffffffe4 & 0xffffff;
    iVar2 = SafeInt::operator_cast_to_int
                      ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       (CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0) &
                       0xffffffffffffff));
    DivisionHelper<unsigned_char,_int,_1>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((uchar *)CONCAT44(uVar3,iVar2),in_stack_ffffffffffffffd8,(uchar *)0x1bd0ca);
    SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_char>
              ((SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT44(uVar3,iVar2),(uchar *)in_stack_ffffffffffffffd8);
    in_stack_fffffffffffffff0.m_int = in_stack_fffffffffffffffc;
  }
  return (SafeInt<int,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         in_stack_fffffffffffffff0.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}